

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestReserve(void)

{
  _Map_pointer ppCVar1;
  ulong uVar2;
  element_type *peVar3;
  int iVar4;
  size_type sVar5;
  ulong uVar6;
  undefined8 local_108;
  size_t *local_100;
  size_t *local_f8;
  undefined8 local_f0;
  begin local_e8;
  size_t **local_d0;
  lazy_ostream local_c8;
  undefined8 *local_b8;
  size_t **local_b0;
  _func_int **local_a8;
  assertion_result local_a0;
  size_t reserveSize;
  OutputBuffer ob;
  const_string local_68;
  undefined **local_58;
  lazy_ostream local_50;
  undefined8 *local_40;
  char *local_38;
  
  local_e8.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_e8.m_file_name.m_end = "";
  local_e8.m_line_num = 0x43;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_50._vptr_lazy_ostream = (_func_int **)CONCAT71(local_50._vptr_lazy_ostream._1_7_,1);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc770;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = (size_t **)0x1b317f;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_50);
  avro::OutputBuffer::OutputBuffer(&ob,0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x46;
  local_50.m_empty = false;
  local_a8 = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  reserveSize = (ob.pimpl_.px)->size_;
  local_f8 = &reserveSize;
  local_108._0_4_ = 0;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reserveSize == 0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_b0 = &local_f8;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_001dc830;
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc830;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_100 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x46,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c8,"0U",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x47;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  reserveSize = (ob.pimpl_.px)->freeSpace_;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reserveSize == 0);
  local_108._0_4_ = 0;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f8 = &reserveSize;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)local_58;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_100 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x47,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c8,"0U",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x48;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  reserveSize = CONCAT44(reserveSize._4_4_,iVar4);
  local_108._0_4_ = 0;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f8 = &reserveSize;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_100 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x48,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c8,"0",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x49;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  reserveSize = CONCAT44(reserveSize._4_4_,iVar4);
  local_108 = (ulong)local_108._4_4_ << 0x20;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8.m_empty = false;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f8 = &reserveSize;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_100 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x49,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c8,
             "0",&local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  reserveSize = 0x800;
  avro::OutputBuffer::OutputBuffer(&ob,0x800);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x50;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_108 = (ob.pimpl_.px)->size_;
  local_100 = &local_f0;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_f0._0_4_ = 0;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)local_58;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x50,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c8,"0U",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x51;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_108 = (ob.pimpl_.px)->freeSpace_;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0x1000);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &avro::detail::kMinBlockSize;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc7f0;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x51,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c8,
             "kMinBlockSize",&local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x52;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 1);
  local_f0._0_4_ = 1;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8.m_empty = false;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  local_108._0_4_ = iVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x52,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c8,"1",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x53;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_108 = CONCAT44(local_108._4_4_,iVar4);
  local_f0 = (ulong)local_f0._4_4_ << 0x20;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8.m_empty = false;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x53,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c8,
             "0",&local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  peVar3 = ob.pimpl_.px;
  uVar6 = reserveSize + 0x2000;
  uVar2 = (ob.pimpl_.px)->freeSpace_;
  reserveSize = uVar6;
  while (uVar2 < uVar6) {
    sVar5 = uVar6 - uVar2;
    if (0x3fff < sVar5) {
      sVar5 = 0x4000;
    }
    if (sVar5 < 0x1001) {
      sVar5 = 0x1000;
    }
    avro::detail::BufferImpl::allocChunkChecked(peVar3,sVar5);
    uVar2 = peVar3->freeSpace_;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x59;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_108 = (ob.pimpl_.px)->size_;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_f0 = local_f0 & 0xffffffff00000000;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)local_58;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x59,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c8,"0U",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5a;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_108 = (ob.pimpl_.px)->freeSpace_;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == reserveSize);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &reserveSize;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc7f0;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x5a,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c8,
             "reserveSize",&local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5b;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 2);
  local_f0._0_4_ = 2;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8.m_empty = false;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  local_108._0_4_ = iVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x5b,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c8,"2",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5c;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_108 = CONCAT44(local_108._4_4_,iVar4);
  local_f0 = (ulong)local_f0._4_4_ << 0x20;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8.m_empty = false;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x5c,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c8,
             "0",&local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  peVar3 = ob.pimpl_.px;
  uVar6 = reserveSize + 0x4800;
  uVar2 = (ob.pimpl_.px)->freeSpace_;
  reserveSize = uVar6;
  while (uVar2 < uVar6) {
    sVar5 = uVar6 - uVar2;
    if (0x3fff < sVar5) {
      sVar5 = 0x4000;
    }
    if (sVar5 < 0x1001) {
      sVar5 = 0x1000;
    }
    avro::detail::BufferImpl::allocChunkChecked(peVar3,sVar5);
    uVar2 = peVar3->freeSpace_;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 99;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_108 = (ob.pimpl_.px)->size_;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_f0 = local_f0 & 0xffffffff00000000;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)local_58;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,99,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c8,"0U",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 100;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_108 = (ob.pimpl_.px)->freeSpace_;
  local_f0 = reserveSize + 0x800;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == local_f0);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7f0;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc7f0;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,100,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c8,
             "reserveSize + kMinBlockSize/2",&local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x65;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 4);
  local_f0._0_4_ = 4;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8.m_empty = false;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  local_108._0_4_ = iVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x65,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c8,"4",
             &local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x66;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_108 = CONCAT44(local_108._4_4_,iVar4);
  local_f0 = (ulong)local_f0._4_4_ << 0x20;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc870;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f8;
  local_100 = &local_f0;
  local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
  local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc870;
  local_e8.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_100;
  local_f8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_50,&local_68,0x66,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c8,
             "0",&local_e8);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  return;
}

Assistant:

void TestReserve()
{
    BOOST_TEST_MESSAGE( "TestReserve");
    {
        OutputBuffer ob;
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(ob.numChunks(), 0);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }

    {
        size_t reserveSize = kMinBlockSize/2;

        OutputBuffer ob (reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kMinBlockSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);

        // reserve should add a single block
        reserveSize += 8192;

        ob.reserve(reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);

        // reserve should add two blocks, one of the maximum size and
        // one of the minimum size
        reserveSize += (kMaxBlockSize + kMinBlockSize/2);

        ob.reserve(reserveSize);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize + kMinBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 4);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }
}